

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

Vec_Int_t * Mop_ManCollectStats(Mop_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  word *pwVar2;
  word *pCube;
  uint i;
  uint nSize;
  int i_00;
  byte bVar3;
  
  iVar1 = p->nWordsIn;
  nSize = iVar1 << 5;
  p_00 = Vec_IntStart(nSize);
  i_00 = 0;
  if (iVar1 << 5 < 1) {
    nSize = 0;
  }
  for (; i_00 < p->vCubes->nSize; i_00 = i_00 + 1) {
    iVar1 = Vec_IntEntry(p->vCubes,i_00);
    pwVar2 = Mop_ManCubeIn(p,iVar1);
    pCube = Mop_ManCubeOut(p,iVar1);
    iVar1 = Mop_ManCountOnes(pCube,p->nWordsOut);
    bVar3 = 0;
    for (i = 0; nSize != i; i = i + 1) {
      if ((pwVar2[i >> 5] >> (bVar3 & 0x3e) & 3) != 0) {
        Vec_IntAddToEntry(p_00,i,iVar1);
      }
      bVar3 = bVar3 + 2;
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManCollectStats( Mop_Man_t * p )
{
    int i, v, iCube, nVars = 32 * p->nWordsIn;
    Vec_Int_t * vStats = Vec_IntStart( nVars );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    {
        word * pCube = Mop_ManCubeIn(p, iCube);
        int nOutLits = Mop_ManCountOnes( Mop_ManCubeOut(p, iCube), p->nWordsOut );
        for ( v = 0; v < nVars; v++ )
            if ( Abc_TtGetQua(pCube, v) )
                Vec_IntAddToEntry( vStats, v, nOutLits );
    }
    return vStats;
}